

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestApp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_1390;
  int i;
  undefined1 local_1380 [8];
  Server WebServer;
  NetworkConfig config;
  char **argv_local;
  int argc_local;
  
  WebServer.AuthHandler._4_4_ = 1;
  http::Server::Server((Server *)local_1380);
  printf("%d bit build\n",0x40);
  local_1390 = 1;
  while( true ) {
    if (argc <= local_1390) {
      http::Server::RegisterPageHandler((Server *)local_1380,ProcessPageRequest);
      osThread::Create(&NetworkThread,NetworkEntry,"Network",0x400,10,
                       (void *)((long)&WebServer.AuthHandler + 4));
      usleep(1000000);
      osEvent::Wait(&StartEvent,
                    "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/test_app/TestApp.cpp"
                    ,0x16c,-1);
      http::Server::Initialize((Server *)local_1380,(InterfaceMAC *)&tcpStack,&tcpStack.TCP,0x50);
      DefaultStack::StartDHCP(&tcpStack);
      do {
        usleep(100000);
        DefaultStack::Tick(&tcpStack);
      } while( true );
    }
    iVar1 = strcmp(argv[local_1390],"-devices");
    if (iVar1 == 0) break;
    iVar1 = strcmp(argv[local_1390],"-use");
    if (iVar1 != 0) {
      printf("unknown option \'%s\'\n",argv[local_1390]);
      argv_local._4_4_ = -1;
      goto LAB_00104905;
    }
    WebServer.AuthHandler._4_4_ = atoi(argv[local_1390 + 1]);
    local_1390 = local_1390 + 2;
  }
  PacketIO::DisplayDevices();
  argv_local._4_4_ = 0;
LAB_00104905:
  http::Server::~Server((Server *)local_1380);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    NetworkConfig config;
    config.interfaceNumber = 1;
    http::Server WebServer;

    printf("%d bit build\n", (sizeof(void*) == 4 ? 32 : 64));

    // Start at 1 to skip the file name
    for (int i = 1; i < argc; i++)
    {
        if (!strcmp(argv[i], "-devices"))
        {
            PacketIO::DisplayDevices();
            return 0;
        }
        else if (!strcmp(argv[i], "-use"))
        {
            config.interfaceNumber = atoi(argv[++i]);
        }
        else
        {
            printf("unknown option '%s'\n", argv[i]);
            return -1;
        }
    }

    WebServer.RegisterPageHandler(ProcessPageRequest);
    NetworkThread.Create(NetworkEntry, "Network", 1024, 10, &config);

#ifdef _WIN32
    Sleep(1000);
#elif __linux__
    usleep(1000000);
#endif
    StartEvent.Wait(__FILE__, __LINE__);

    WebServer.Initialize(tcpStack.MAC, tcpStack.TCP, 80);

    tcpStack.StartDHCP();

    while (1)
    {
#ifdef _WIN32
        Sleep(100);
#elif __linux__
        usleep(100000);
#endif
        tcpStack.Tick();
    }
}